

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O0

GLboolean valid_version(void)

{
  int local_18;
  int local_14;
  int revision;
  int minor;
  int major;
  
  glfwGetVersion(&revision,&local_14,&local_18);
  if (revision == 3) {
    if ((local_14 != 1) || (local_18 != 2)) {
      printf("*** WARNING: GLFW version mismatch! ***\n");
    }
    minor._3_1_ = '\x01';
  }
  else {
    printf("*** ERROR: GLFW major version mismatch! ***\n");
    minor._3_1_ = '\0';
  }
  return minor._3_1_;
}

Assistant:

static GLboolean valid_version(void)
{
    int major, minor, revision;
    glfwGetVersion(&major, &minor, &revision);

    if (major != GLFW_VERSION_MAJOR)
    {
        printf("*** ERROR: GLFW major version mismatch! ***\n");
        return GL_FALSE;
    }

    if (minor != GLFW_VERSION_MINOR || revision != GLFW_VERSION_REVISION)
        printf("*** WARNING: GLFW version mismatch! ***\n");

    return GL_TRUE;
}